

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzrule.cpp
# Opt level: O2

UBool __thiscall
icu_63::AnnualTimeZoneRule::isEquivalentTo(AnnualTimeZoneRule *this,TimeZoneRule *other)

{
  bool bVar1;
  UBool UVar2;
  
  if (this == (AnnualTimeZoneRule *)other) {
    return '\x01';
  }
  bVar1 = std::type_info::operator!=
                    ((type_info *)(this->super_TimeZoneRule).super_UObject._vptr_UObject[-1],
                     (type_info *)(other->super_UObject)._vptr_UObject[-1]);
  if ((((!bVar1) &&
       (UVar2 = TimeZoneRule::isEquivalentTo(&this->super_TimeZoneRule,other), UVar2 != '\0')) &&
      (UVar2 = DateTimeRule::operator==
                         (this->fDateTimeRule,(DateTimeRule *)other[1].super_UObject._vptr_UObject),
      UVar2 != '\0')) &&
     (this->fStartYear == *(int *)&other[1].fName.super_Replaceable.super_UObject._vptr_UObject)) {
    return this->fEndYear ==
           *(int *)((long)&other[1].fName.super_Replaceable.super_UObject._vptr_UObject + 4);
  }
  return '\0';
}

Assistant:

UBool
AnnualTimeZoneRule::isEquivalentTo(const TimeZoneRule& other) const {
    if (this == &other) {
        return TRUE;
    }
    if (typeid(*this) != typeid(other) || TimeZoneRule::isEquivalentTo(other) == FALSE) {
        return FALSE;
    }
    AnnualTimeZoneRule* that = (AnnualTimeZoneRule*)&other;
    return (*fDateTimeRule == *(that->fDateTimeRule) &&
            fStartYear == that->fStartYear &&
            fEndYear == that->fEndYear);
}